

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  int local_14;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"\nExecuting test...");
  std::endl<char,std::char_traits<char>>(poVar2);
  testing::InitGoogleTest(&local_14,argv);
  iVar1 = RUN_ALL_TESTS();
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
	std::cout << "\nExecuting test..." << std::endl;

	::testing::InitGoogleTest(&argc, argv);
	return RUN_ALL_TESTS();
}